

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

Node * __thiscall llvm::yaml::Document::parseBlockNode(Document *this)

{
  pointer pcVar1;
  Stream *pSVar2;
  _func_int **pp_Var3;
  long *__src;
  Token *pTVar4;
  Node *pNVar5;
  char *pcVar6;
  string *this_00;
  ptrdiff_t _Num;
  unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *puVar7;
  SMLoc Start;
  unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *puVar8;
  _func_int **pp_Var9;
  Token AnchorInfo;
  Token TagInfo;
  Child local_2a8;
  char *pcStack_2a0;
  size_t sStack_298;
  undefined1 *local_290;
  undefined8 local_288;
  undefined1 local_280;
  undefined7 uStack_27f;
  ulong local_268;
  _func_int **pp_Stack_260;
  unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *local_258;
  long *local_250;
  long local_248;
  long local_240 [3];
  Child local_228;
  char *pcStack_220;
  size_t sStack_218;
  undefined1 *local_210;
  undefined8 local_208;
  undefined1 local_200;
  undefined7 uStack_1ff;
  Child local_1f0;
  char *pcStack_1e8;
  size_t local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  Token local_1b8;
  Token local_180;
  Token local_148;
  Token local_110;
  Token local_d8;
  Token local_a0;
  Token local_68;
  
  pTVar4 = Scanner::peekNext((Scanner *)
                             (this->stream->scanner)._M_t.
                             super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                             .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
  local_268 = *(ulong *)pTVar4;
  pp_Stack_260 = (_func_int **)(pTVar4->Range).Data;
  local_258 = (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)
              (pTVar4->Range).Length;
  local_250 = local_240;
  pcVar1 = (pTVar4->Value)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_250,pcVar1,pcVar1 + (pTVar4->Value)._M_string_length);
  local_2a8.twine = (Twine *)0x0;
  pcStack_2a0 = (char *)0x0;
  sStack_298 = 0;
  local_290 = &local_280;
  local_288 = 0;
  local_280 = 0;
  local_228.twine = (Twine *)((ulong)(uint)local_228._4_4_ << 0x20);
  pcStack_220 = (char *)0x0;
  sStack_218 = 0;
  local_210 = &local_200;
  local_208 = 0;
  local_200 = 0;
LAB_0016db7d:
  switch(local_268 & 0xffffffff) {
  case 0:
    goto switchD_0016db92_caseD_0;
  default:
    pNVar5 = (Node *)BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                               (&this->NodeAllocator,0x48,0x10);
    pSVar2 = this->stream;
    pNVar5->_vptr_Node = (_func_int **)&PTR_anchor_001e7ea0;
    pNVar5->Doc = &pSVar2->CurrentDoc;
    (pNVar5->SourceRange).Start.Ptr = (char *)0x0;
    (pNVar5->SourceRange).End.Ptr = (char *)0x0;
    pNVar5->TypeID = 0;
    (pNVar5->Tag).Data = (char *)0x0;
    (pNVar5->Tag).Length = 0;
    (pNVar5->Anchor).Data = (char *)0x0;
    (pNVar5->Anchor).Length = 0;
    pTVar4 = Scanner::peekNext(*(Scanner **)
                                ((pSVar2->CurrentDoc)._M_t.
                                 super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                 .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)
                                ->stream);
    pcVar6 = (pTVar4->Range).Data;
    (pNVar5->SourceRange).Start.Ptr = pcVar6;
    (pNVar5->SourceRange).End.Ptr = pcVar6;
    pNVar5->_vptr_Node = (_func_int **)&PTR_anchor_001e7ec0;
    goto LAB_0016e478;
  case 7:
    pNVar5 = (Node *)BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                               (&this->NodeAllocator,0x58,0x10);
    pSVar2 = this->stream;
    pNVar5->_vptr_Node = (_func_int **)&PTR_anchor_001e7ea0;
    pNVar5->Doc = &pSVar2->CurrentDoc;
    (pNVar5->SourceRange).Start.Ptr = (char *)0x0;
    (pNVar5->SourceRange).End.Ptr = (char *)0x0;
    pNVar5->TypeID = 5;
    (pNVar5->Anchor).Data = pcStack_2a0 + (sStack_298 != 0);
    (pNVar5->Anchor).Length = sStack_298 - (sStack_298 != 0);
    (pNVar5->Tag).Data = pcStack_220;
    (pNVar5->Tag).Length = sStack_218;
    pTVar4 = Scanner::peekNext(*(Scanner **)
                                ((pSVar2->CurrentDoc)._M_t.
                                 super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                 .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)
                                ->stream);
    pcVar6 = (pTVar4->Range).Data;
    (pNVar5->SourceRange).Start.Ptr = pcVar6;
    (pNVar5->SourceRange).End.Ptr = pcVar6;
    pNVar5->_vptr_Node = (_func_int **)&PTR_anchor_001e7f60;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 2;
    break;
  case 9:
    Scanner::getNext(&local_a0,
                     (Scanner *)
                     (this->stream->scanner)._M_t.
                     super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                     .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.Value._M_dataplus._M_p != &local_a0.Value.field_2) {
      operator_delete(local_a0.Value._M_dataplus._M_p,
                      local_a0.Value.field_2._M_allocated_capacity + 1);
    }
    pNVar5 = (Node *)BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                               (&this->NodeAllocator,0x58,0x10);
    pSVar2 = this->stream;
    pNVar5->_vptr_Node = (_func_int **)&PTR_anchor_001e7ea0;
    pNVar5->Doc = &pSVar2->CurrentDoc;
    (pNVar5->SourceRange).Start.Ptr = (char *)0x0;
    (pNVar5->SourceRange).End.Ptr = (char *)0x0;
    pNVar5->TypeID = 5;
    (pNVar5->Anchor).Data = pcStack_2a0 + (sStack_298 != 0);
    (pNVar5->Anchor).Length = sStack_298 - (sStack_298 != 0);
    (pNVar5->Tag).Data = pcStack_220;
    (pNVar5->Tag).Length = sStack_218;
    pTVar4 = Scanner::peekNext(*(Scanner **)
                                ((pSVar2->CurrentDoc)._M_t.
                                 super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                 .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)
                                ->stream);
    pcVar6 = (pTVar4->Range).Data;
    (pNVar5->SourceRange).Start.Ptr = pcVar6;
    (pNVar5->SourceRange).End.Ptr = pcVar6;
    pNVar5->_vptr_Node = (_func_int **)&PTR_anchor_001e7f60;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 0;
    break;
  case 10:
    Scanner::getNext(&local_d8,
                     (Scanner *)
                     (this->stream->scanner)._M_t.
                     super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                     .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.Value._M_dataplus._M_p != &local_d8.Value.field_2) {
      operator_delete(local_d8.Value._M_dataplus._M_p,
                      local_d8.Value.field_2._M_allocated_capacity + 1);
    }
    pNVar5 = (Node *)BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                               (&this->NodeAllocator,0x58,0x10);
    pSVar2 = this->stream;
    pNVar5->_vptr_Node = (_func_int **)&PTR_anchor_001e7ea0;
    pNVar5->Doc = &pSVar2->CurrentDoc;
    (pNVar5->SourceRange).Start.Ptr = (char *)0x0;
    (pNVar5->SourceRange).End.Ptr = (char *)0x0;
    pNVar5->TypeID = 4;
    (pNVar5->Anchor).Data = pcStack_2a0 + (sStack_298 != 0);
    (pNVar5->Anchor).Length = sStack_298 - (sStack_298 != 0);
    (pNVar5->Tag).Data = pcStack_220;
    (pNVar5->Tag).Length = sStack_218;
    pTVar4 = Scanner::peekNext(*(Scanner **)
                                ((pSVar2->CurrentDoc)._M_t.
                                 super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                 .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)
                                ->stream);
    pcVar6 = (pTVar4->Range).Data;
    (pNVar5->SourceRange).Start.Ptr = pcVar6;
    (pNVar5->SourceRange).End.Ptr = pcVar6;
    pNVar5->_vptr_Node = (_func_int **)&PTR_anchor_001e7f40;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 0;
    goto LAB_0016e28d;
  case 0xc:
    Scanner::getNext(&local_110,
                     (Scanner *)
                     (this->stream->scanner)._M_t.
                     super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                     .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.Value._M_dataplus._M_p != &local_110.Value.field_2) {
      operator_delete(local_110.Value._M_dataplus._M_p,
                      local_110.Value.field_2._M_allocated_capacity + 1);
    }
    pNVar5 = (Node *)BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                               (&this->NodeAllocator,0x58,0x10);
    pSVar2 = this->stream;
    pNVar5->_vptr_Node = (_func_int **)&PTR_anchor_001e7ea0;
    pNVar5->Doc = &pSVar2->CurrentDoc;
    (pNVar5->SourceRange).Start.Ptr = (char *)0x0;
    (pNVar5->SourceRange).End.Ptr = (char *)0x0;
    pNVar5->TypeID = 5;
    (pNVar5->Anchor).Data = pcStack_2a0 + (sStack_298 != 0);
    (pNVar5->Anchor).Length = sStack_298 - (sStack_298 != 0);
    (pNVar5->Tag).Data = pcStack_220;
    (pNVar5->Tag).Length = sStack_218;
    pTVar4 = Scanner::peekNext(*(Scanner **)
                                ((pSVar2->CurrentDoc)._M_t.
                                 super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                 .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)
                                ->stream);
    pcVar6 = (pTVar4->Range).Data;
    (pNVar5->SourceRange).Start.Ptr = pcVar6;
    (pNVar5->SourceRange).End.Ptr = pcVar6;
    pNVar5->_vptr_Node = (_func_int **)&PTR_anchor_001e7f60;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 1;
    break;
  case 0xe:
    Scanner::getNext(&local_148,
                     (Scanner *)
                     (this->stream->scanner)._M_t.
                     super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                     .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148.Value._M_dataplus._M_p != &local_148.Value.field_2) {
      operator_delete(local_148.Value._M_dataplus._M_p,
                      local_148.Value.field_2._M_allocated_capacity + 1);
    }
    pNVar5 = (Node *)BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                               (&this->NodeAllocator,0x58,0x10);
    pSVar2 = this->stream;
    pNVar5->_vptr_Node = (_func_int **)&PTR_anchor_001e7ea0;
    pNVar5->Doc = &pSVar2->CurrentDoc;
    (pNVar5->SourceRange).Start.Ptr = (char *)0x0;
    (pNVar5->SourceRange).End.Ptr = (char *)0x0;
    pNVar5->TypeID = 4;
    (pNVar5->Anchor).Data = pcStack_2a0 + (sStack_298 != 0);
    (pNVar5->Anchor).Length = sStack_298 - (sStack_298 != 0);
    (pNVar5->Tag).Data = pcStack_220;
    (pNVar5->Tag).Length = sStack_218;
    pTVar4 = Scanner::peekNext(*(Scanner **)
                                ((pSVar2->CurrentDoc)._M_t.
                                 super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                 .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)
                                ->stream);
    pcVar6 = (pTVar4->Range).Data;
    (pNVar5->SourceRange).Start.Ptr = pcVar6;
    (pNVar5->SourceRange).End.Ptr = pcVar6;
    pNVar5->_vptr_Node = (_func_int **)&PTR_anchor_001e7f40;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 1;
    goto LAB_0016e28d;
  case 0x10:
    pNVar5 = (Node *)BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                               (&this->NodeAllocator,0x58,0x10);
    pSVar2 = this->stream;
    pNVar5->_vptr_Node = (_func_int **)&PTR_anchor_001e7ea0;
    pNVar5->Doc = &pSVar2->CurrentDoc;
    (pNVar5->SourceRange).Start.Ptr = (char *)0x0;
    (pNVar5->SourceRange).End.Ptr = (char *)0x0;
    pNVar5->TypeID = 4;
    (pNVar5->Anchor).Data = pcStack_2a0 + (sStack_298 != 0);
    (pNVar5->Anchor).Length = sStack_298 - (sStack_298 != 0);
    (pNVar5->Tag).Data = pcStack_220;
    (pNVar5->Tag).Length = sStack_218;
    pTVar4 = Scanner::peekNext(*(Scanner **)
                                ((pSVar2->CurrentDoc)._M_t.
                                 super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                 .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)
                                ->stream);
    pcVar6 = (pTVar4->Range).Data;
    (pNVar5->SourceRange).Start.Ptr = pcVar6;
    (pNVar5->SourceRange).End.Ptr = pcVar6;
    pNVar5->_vptr_Node = (_func_int **)&PTR_anchor_001e7f40;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 2;
LAB_0016e28d:
    *(undefined2 *)((long)&pNVar5[1]._vptr_Node + 4) = 1;
    goto LAB_0016e293;
  case 0x12:
    Scanner::getNext(&local_180,
                     (Scanner *)
                     (this->stream->scanner)._M_t.
                     super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                     .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.Value._M_dataplus._M_p != &local_180.Value.field_2) {
      operator_delete(local_180.Value._M_dataplus._M_p,
                      local_180.Value.field_2._M_allocated_capacity + 1);
    }
    pNVar5 = (Node *)BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                               (&this->NodeAllocator,0x58,0x10);
    puVar8 = local_258;
    pp_Var9 = pp_Stack_260;
    pSVar2 = this->stream;
    pNVar5->_vptr_Node = (_func_int **)&PTR_anchor_001e7ea0;
    pNVar5->Doc = &pSVar2->CurrentDoc;
    (pNVar5->SourceRange).Start.Ptr = (char *)0x0;
    (pNVar5->SourceRange).End.Ptr = (char *)0x0;
    pNVar5->TypeID = 1;
    (pNVar5->Anchor).Data = pcStack_2a0 + (sStack_298 != 0);
    (pNVar5->Anchor).Length = sStack_298 - (sStack_298 != 0);
    (pNVar5->Tag).Data = pcStack_220;
    (pNVar5->Tag).Length = sStack_218;
    Scanner::peekNext(*(Scanner **)
                       ((pSVar2->CurrentDoc)._M_t.
                        super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                        .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->stream)
    ;
    pNVar5->_vptr_Node = (_func_int **)&PTR_anchor_001e7ee0;
    pNVar5[1]._vptr_Node = pp_Var9;
    pNVar5[1].Doc = puVar8;
    (pNVar5->SourceRange).Start.Ptr = (char *)pp_Var9;
    (pNVar5->SourceRange).End.Ptr = (char *)((long)pp_Var9 + (long)&puVar8->_M_t);
    goto LAB_0016e478;
  case 0x13:
    Scanner::getNext(&local_1b8,
                     (Scanner *)
                     (this->stream->scanner)._M_t.
                     super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                     .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8.Value._M_dataplus._M_p != &local_1b8.Value.field_2) {
      operator_delete(local_1b8.Value._M_dataplus._M_p,
                      local_1b8.Value.field_2._M_allocated_capacity + 1);
    }
    __src = local_250;
    pp_Var9 = (_func_int **)0x0;
    puVar7 = (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)
             (local_248 + 1);
    puVar8 = (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)0x0;
    if (puVar7 != (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)
                  0x0) {
      pp_Var9 = (_func_int **)
                BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                          (&this->NodeAllocator,(size_t)puVar7,1);
      memmove(pp_Var9,__src,(size_t)puVar7);
      puVar8 = puVar7;
    }
    if (puVar8 == (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)
                  0x0) {
      __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                    ,0x28f,"StringRef llvm::StringRef::drop_back(size_t) const");
    }
    puVar7 = (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)
             ((long)&puVar8[-1]._M_t.
                     super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                     .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl + 7);
    if (puVar8 < puVar7) {
      puVar7 = puVar8;
    }
    pNVar5 = (Node *)BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                               (&this->NodeAllocator,0x58,0x10);
    pp_Var3 = pp_Stack_260;
    pSVar2 = this->stream;
    pcVar6 = (char *)((long)pp_Stack_260 + (long)&local_258->_M_t);
    pNVar5->_vptr_Node = (_func_int **)&PTR_anchor_001e7ea0;
    pNVar5->Doc = &pSVar2->CurrentDoc;
    (pNVar5->SourceRange).Start.Ptr = (char *)0x0;
    (pNVar5->SourceRange).End.Ptr = (char *)0x0;
    pNVar5->TypeID = 2;
    (pNVar5->Anchor).Data = pcStack_2a0 + (sStack_298 != 0);
    (pNVar5->Anchor).Length = sStack_298 - (sStack_298 != 0);
    (pNVar5->Tag).Data = pcStack_220;
    (pNVar5->Tag).Length = sStack_218;
    Scanner::peekNext(*(Scanner **)
                       ((pSVar2->CurrentDoc)._M_t.
                        super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                        .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->stream)
    ;
    pNVar5->_vptr_Node = (_func_int **)&PTR_anchor_001e7f00;
    pNVar5[1]._vptr_Node = pp_Var9;
    pNVar5[1].Doc = puVar7;
    (pNVar5->SourceRange).Start.Ptr = (char *)pp_Var3;
    (pNVar5->SourceRange).End.Ptr = pcVar6;
    goto LAB_0016e478;
  case 0x14:
    Scanner::getNext(&local_68,
                     (Scanner *)
                     (this->stream->scanner)._M_t.
                     super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                     .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.Value._M_dataplus._M_p != &local_68.Value.field_2) {
      operator_delete(local_68.Value._M_dataplus._M_p,
                      local_68.Value.field_2._M_allocated_capacity + 1);
    }
    pNVar5 = (Node *)BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                               (&this->NodeAllocator,0x58,0x10);
    pSVar2 = this->stream;
    puVar8 = (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)
             ((long)local_258 -
             (ulong)(local_258 !=
                    (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)
                    0x0));
    pp_Var9 = (_func_int **)
              ((long)pp_Stack_260 +
              (ulong)(local_258 !=
                     (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *
                     )0x0));
    pNVar5->_vptr_Node = (_func_int **)&PTR_anchor_001e7ea0;
    pNVar5->Doc = &pSVar2->CurrentDoc;
    (pNVar5->SourceRange).Start.Ptr = (char *)0x0;
    (pNVar5->SourceRange).End.Ptr = (char *)0x0;
    pNVar5->TypeID = 6;
    (pNVar5->Tag).Data = (char *)0x0;
    (pNVar5->Tag).Length = 0;
    (pNVar5->Anchor).Data = (char *)0x0;
    (pNVar5->Anchor).Length = 0;
    pTVar4 = Scanner::peekNext(*(Scanner **)
                                ((pSVar2->CurrentDoc)._M_t.
                                 super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                 .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)
                                ->stream);
    pcVar6 = (pTVar4->Range).Data;
    (pNVar5->SourceRange).Start.Ptr = pcVar6;
    (pNVar5->SourceRange).End.Ptr = pcVar6;
    pNVar5->_vptr_Node = (_func_int **)&PTR_anchor_001e7f80;
    pNVar5[1]._vptr_Node = pp_Var9;
    pNVar5[1].Doc = puVar8;
    goto LAB_0016e478;
  case 0x15:
    if (local_2a8._0_4_ == 0x15) {
      pcVar6 = "Already encountered an anchor for this node!";
      goto LAB_0016e453;
    }
    Scanner::getNext((Token *)&local_1f0,
                     (Scanner *)
                     (this->stream->scanner)._M_t.
                     super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                     .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
    sStack_298 = local_1e0;
    local_2a8 = local_1f0;
    pcStack_2a0 = pcStack_1e8;
    this_00 = (string *)&local_290;
LAB_0016dc0b:
    std::__cxx11::string::operator=(this_00,(string *)local_1d8);
    if (local_1d8[0] != &local_1c8) {
      operator_delete(local_1d8[0],local_1c8._M_allocated_capacity + 1);
    }
    pTVar4 = Scanner::peekNext((Scanner *)
                               (this->stream->scanner)._M_t.
                               super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                               .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
    local_268 = *(ulong *)pTVar4;
    pp_Stack_260 = (_func_int **)(pTVar4->Range).Data;
    local_258 = (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)
                (pTVar4->Range).Length;
    std::__cxx11::string::_M_assign((string *)&local_250);
    goto LAB_0016db7d;
  case 0x16:
    if (local_228._0_4_ != 0x16) {
      Scanner::getNext((Token *)&local_1f0,
                       (Scanner *)
                       (this->stream->scanner)._M_t.
                       super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                       .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
      sStack_218 = local_1e0;
      local_228 = local_1f0;
      pcStack_220 = pcStack_1e8;
      this_00 = (string *)&local_210;
      goto LAB_0016dc0b;
    }
    pcVar6 = "Already encountered a tag for this node!";
LAB_0016e453:
    Twine::Twine((Twine *)&local_1f0,pcVar6);
    Scanner::setError((Scanner *)
                      (this->stream->scanner)._M_t.
                      super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                      .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>,(Twine *)&local_1f0,
                      (iterator)pp_Stack_260);
    goto switchD_0016db92_caseD_0;
  }
  *(undefined2 *)((long)&pNVar5[1]._vptr_Node + 4) = 1;
  *(undefined1 *)((long)&pNVar5[1]._vptr_Node + 6) = 1;
LAB_0016e293:
  pNVar5[1].Doc =
       (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)0x0;
  goto LAB_0016e478;
switchD_0016db92_caseD_0:
  pNVar5 = (Node *)0x0;
LAB_0016e478:
  if (local_210 != &local_200) {
    operator_delete(local_210,CONCAT71(uStack_1ff,local_200) + 1);
  }
  if (local_290 != &local_280) {
    operator_delete(local_290,CONCAT71(uStack_27f,local_280) + 1);
  }
  if (local_250 != local_240) {
    operator_delete(local_250,local_240[0] + 1);
  }
  return pNVar5;
}

Assistant:

Node *Document::parseBlockNode() {
  Token T = peekNext();
  // Handle properties.
  Token AnchorInfo;
  Token TagInfo;
parse_property:
  switch (T.Kind) {
  case Token::TK_Alias:
    getNext();
    return new (NodeAllocator) AliasNode(stream.CurrentDoc, T.Range.substr(1));
  case Token::TK_Anchor:
    if (AnchorInfo.Kind == Token::TK_Anchor) {
      setError("Already encountered an anchor for this node!", T);
      return nullptr;
    }
    AnchorInfo = getNext(); // Consume TK_Anchor.
    T = peekNext();
    goto parse_property;
  case Token::TK_Tag:
    if (TagInfo.Kind == Token::TK_Tag) {
      setError("Already encountered a tag for this node!", T);
      return nullptr;
    }
    TagInfo = getNext(); // Consume TK_Tag.
    T = peekNext();
    goto parse_property;
  default:
    break;
  }

  switch (T.Kind) {
  case Token::TK_BlockEntry:
    // We got an unindented BlockEntry sequence. This is not terminated with
    // a BlockEnd.
    // Don't eat the TK_BlockEntry, SequenceNode needs it.
    return new (NodeAllocator) SequenceNode( stream.CurrentDoc
                                           , AnchorInfo.Range.substr(1)
                                           , TagInfo.Range
                                           , SequenceNode::ST_Indentless);
  case Token::TK_BlockSequenceStart:
    getNext();
    return new (NodeAllocator)
      SequenceNode( stream.CurrentDoc
                  , AnchorInfo.Range.substr(1)
                  , TagInfo.Range
                  , SequenceNode::ST_Block);
  case Token::TK_BlockMappingStart:
    getNext();
    return new (NodeAllocator)
      MappingNode( stream.CurrentDoc
                 , AnchorInfo.Range.substr(1)
                 , TagInfo.Range
                 , MappingNode::MT_Block);
  case Token::TK_FlowSequenceStart:
    getNext();
    return new (NodeAllocator)
      SequenceNode( stream.CurrentDoc
                  , AnchorInfo.Range.substr(1)
                  , TagInfo.Range
                  , SequenceNode::ST_Flow);
  case Token::TK_FlowMappingStart:
    getNext();
    return new (NodeAllocator)
      MappingNode( stream.CurrentDoc
                 , AnchorInfo.Range.substr(1)
                 , TagInfo.Range
                 , MappingNode::MT_Flow);
  case Token::TK_Scalar:
    getNext();
    return new (NodeAllocator)
      ScalarNode( stream.CurrentDoc
                , AnchorInfo.Range.substr(1)
                , TagInfo.Range
                , T.Range);
  case Token::TK_BlockScalar: {
    getNext();
    StringRef NullTerminatedStr(T.Value.c_str(), T.Value.length() + 1);
    StringRef StrCopy = NullTerminatedStr.copy(NodeAllocator).drop_back();
    return new (NodeAllocator)
        BlockScalarNode(stream.CurrentDoc, AnchorInfo.Range.substr(1),
                        TagInfo.Range, StrCopy, T.Range);
  }
  case Token::TK_Key:
    // Don't eat the TK_Key, KeyValueNode expects it.
    return new (NodeAllocator)
      MappingNode( stream.CurrentDoc
                 , AnchorInfo.Range.substr(1)
                 , TagInfo.Range
                 , MappingNode::MT_Inline);
  case Token::TK_DocumentStart:
  case Token::TK_DocumentEnd:
  case Token::TK_StreamEnd:
  default:
    // TODO: Properly handle tags. "[!!str ]" should resolve to !!str "", not
    //       !!null null.
    return new (NodeAllocator) NullNode(stream.CurrentDoc);
  case Token::TK_Error:
    return nullptr;
  }
  llvm_unreachable("Control flow shouldn't reach here.");
  return nullptr;
}